

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

HandlePtr dg::vr::RelationsAnalyzer::getCorrespondingByFrom
                    (ValueRelations *toRels,ValueRelations *fromRels,Handle h)

{
  bool bVar1;
  size_type sVar2;
  HandlePtr pBVar3;
  Relations *in_RDX;
  Bucket *in_RSI;
  Handle in_RDI;
  Bucket *toFromH;
  reference_wrapper<const_dg::vr::Bucket> *fromFromH;
  RelationsMap *froms;
  Bucket *in_stack_ffffffffffffff58;
  Bucket *in_stack_ffffffffffffff80;
  ValueRelations *in_stack_ffffffffffffff88;
  undefined1 local_60 [8];
  undefined1 local_58 [48];
  undefined1 *local_28;
  Bucket *local_18;
  Handle local_10;
  Handle local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_60,0,8);
  Relations::Relations((Relations *)0x1d3584);
  Relations::pf((Relations *)0x1d358e);
  ValueRelations::getRelated<dg::vr::Bucket>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_RDX);
  local_28 = local_58;
  sVar2 = std::
          map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          ::size((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                  *)0x1d35bf);
  if (sVar2 == 1) {
    std::
    map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
    ::begin((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
             *)in_stack_ffffffffffffff58);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                  *)0x1d35fa);
    std::reference_wrapper::operator_cast_to_Bucket_
              ((reference_wrapper<const_dg::vr::Bucket> *)0x1d3623);
    pBVar3 = getCorrespondingByContent((ValueRelations *)in_RSI,(ValueRelations *)local_18,local_10)
    ;
    if (pBVar3 == (HandlePtr)0x0) {
      local_8 = (Handle)0x0;
    }
    else {
      bVar1 = ValueRelations::has<dg::vr::Bucket>
                        ((ValueRelations *)in_RSI,local_18,(Type)((ulong)local_10 >> 0x20));
      if (bVar1) {
        local_8 = ValueRelations::getPointedTo<dg::vr::Bucket>
                            ((ValueRelations *)local_10,in_stack_ffffffffffffff58);
      }
      else {
        local_8 = (Handle)0x0;
      }
    }
  }
  else {
    local_8 = (Handle)0x0;
  }
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          *)0x1d36b5);
  return local_8;
}

Assistant:

RelationsAnalyzer::HandlePtr
RelationsAnalyzer::getCorrespondingByFrom(const ValueRelations &toRels,
                                          const ValueRelations &fromRels,
                                          Handle h) {
    const auto &froms = fromRels.getRelated(h, Relations().pf());
    if (froms.size() != 1)
        return nullptr;

    const auto &fromFromH = froms.begin()->first;
    const auto *toFromH =
            getCorrespondingByContent(toRels, fromRels, fromFromH);
    if (!toFromH)
        return nullptr;

    if (!toRels.has(*toFromH, Relations::PT))
        return nullptr;

    return &toRels.getPointedTo(*toFromH);
}